

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMapTestCase.cpp
# Opt level: O0

void __thiscall SuiteFieldMapTests::TesttotalFields::RunImpl(TesttotalFields *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_2e8;
  unsigned_long local_2c8;
  int local_2c0;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  message_order local_270;
  FieldMap local_250 [8];
  FieldMap group2;
  allocator<char> local_1d9;
  string local_1d8;
  message_order local_1b8;
  FieldMap local_198 [8];
  FieldMap group1;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  message_order local_a0;
  FieldMap local_80 [8];
  FieldMap fieldMap;
  TesttotalFields *this_local;
  
  FIX::message_order::message_order(&local_a0,normal);
  FIX::FieldMap::FieldMap(local_80,&local_a0);
  FIX::message_order::~message_order(&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"field1",&local_d1);
  FIX::FieldMap::setField(local_80,1,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"field2",&local_f9);
  FIX::FieldMap::setField(local_80,2,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"field3",&local_121);
  FIX::FieldMap::setField(local_80,3,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  FIX::message_order::message_order(&local_1b8,normal);
  FIX::FieldMap::FieldMap(local_198,&local_1b8);
  FIX::message_order::~message_order(&local_1b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"field4",&local_1d9);
  FIX::FieldMap::setField(local_198,4,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  FIX::FieldMap::addGroup((int)local_80,(FieldMap *)0xa,SUB81(local_198,0));
  FIX::message_order::message_order(&local_270,normal);
  FIX::FieldMap::FieldMap(local_250,&local_270);
  FIX::message_order::~message_order(&local_270);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"field5",&local_291);
  FIX::FieldMap::setField(local_250,5,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"field6",&local_2b9);
  FIX::FieldMap::setField(local_250,6,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  FIX::FieldMap::addGroup((int)local_80,(FieldMap *)0x14,SUB81(local_250,0));
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  local_2c0 = 8;
  local_2c8 = FIX::FieldMap::totalFields();
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_2e8,*ppTVar2,0x78);
  UnitTest::CheckEqual<int,unsigned_long>(results,&local_2c0,&local_2c8,&local_2e8);
  FIX::FieldMap::~FieldMap(local_250);
  FIX::FieldMap::~FieldMap(local_198);
  FIX::FieldMap::~FieldMap(local_80);
  return;
}

Assistant:

TEST(totalFields)
{
  FieldMap fieldMap;
  fieldMap.setField(1, "field1");
  fieldMap.setField(2, "field2");
  fieldMap.setField(3, "field3");

  FieldMap group1;
  group1.setField(4, "field4");
  fieldMap.addGroup(10, group1);
  FieldMap group2;
  group2.setField(5, "field5");
  group2.setField(6, "field6");
  fieldMap.addGroup(20, group2);

  CHECK_EQUAL(8, fieldMap.totalFields());
}